

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

char * read_multi_note(Lexer *lexer,CharBuff *buff)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  
  do {
    while (uVar1 = read_chr(lexer), (int)uVar1 < 0x2a) {
      if ((uVar1 == 10) || (uVar1 == 0xd)) {
        lexer->row_pos = lexer->row_pos + 1;
        lexer->col_pos = 1;
        if (uVar1 == 0xc9) goto LAB_001026d0;
      }
      else if (uVar1 == 0) goto LAB_0010271c;
LAB_001026eb:
      append_chr(buff,(char)uVar1);
    }
    if (uVar1 == 0xc9) {
LAB_001026d0:
      pcVar3 = to_string(buff);
      lexer_error("note is not closed normally",pcVar3,lexer->row_pos,lexer->col_pos);
      goto LAB_001026eb;
    }
    if (uVar1 != 0x2a) goto LAB_001026eb;
    uVar2 = read_chr(lexer);
    if (uVar2 != 0x2a) {
      if (uVar2 != 0x2f) goto LAB_001026eb;
LAB_0010271c:
      pcVar3 = to_string(buff);
      return pcVar3;
    }
    append_chr(buff,'*');
    lexer->last_chr = 0x2a;
  } while( true );
}

Assistant:

char *read_multi_note(Lexer *lexer, CharBuff* buff) {
    int chr;
    int op;
    while ((chr = read_chr(lexer))) {
        if (chr == '*') {
            op = read_chr(lexer);
            // 可能下一个还是 * 那么记录下一个星
            if (op == '*') {
                append_chr(buff, (char) chr);
                unread_chr(lexer, op);
                continue;
            } else if (op == '/') {
                break;
            }
        }
        if (is_new_line(chr)) {
            lexer->row_pos++;
            lexer->col_pos = 1;
        }
        if (chr == END) {
            lexer_error("note is not closed normally",
                        to_string(buff),
                        lexer->row_pos,
                        lexer->col_pos);
        }
        append_chr(buff, (char) chr);
    }
    return to_string(buff);
}